

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_regexp_Symbol_replace(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  ushort uVar1;
  JSShape *sh;
  int iVar2;
  uint uVar5;
  JSRefCountHeader *p;
  int unicode;
  int iVar3;
  BOOL BVar4;
  JSValueUnion p_18;
  JSValueUnion *pJVar6;
  ulong uVar7;
  uint uVar8;
  undefined4 in_register_0000000c;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  size_t size;
  uint32_t from;
  JSValueUnion extraout_RDX;
  JSRefCountHeader *p_9;
  void *pvVar12;
  JSValueUnion JVar13;
  JSValueUnion JVar14;
  int64_t iVar15;
  JSRefCountHeader *p_4;
  ulong idx;
  JSRefCountHeader *p_17;
  JSRefCountHeader *p_1;
  ulong uVar16;
  char cVar17;
  bool bVar18;
  JSValue obj;
  JSValue v;
  JSValue obj_00;
  JSValue obj_01;
  JSValue this_val_00;
  JSValue v_00;
  JSValue v_01;
  JSValue JVar19;
  JSValue JVar20;
  JSValue JVar21;
  JSValue v_02;
  JSValue JVar22;
  JSValue JVar23;
  JSValue obj_02;
  JSValue this_obj;
  JSValue this_obj_00;
  JSRefCountHeader *p_2;
  JSRefCountHeader *p_8;
  JSRefCountHeader *p_7;
  JSRefCountHeader *p_13;
  uint32_t nCaptures;
  int64_t position;
  int64_t thisIndex;
  ValueBuffer v_b;
  JSValueUnion local_1d0;
  JSValueUnion local_1c8;
  JSValueUnion local_1c0;
  JSValueUnion local_1b8;
  JSValue *local_1a8;
  ulong local_198;
  int64_t local_190;
  JSValueUnion local_188;
  uint local_180;
  int64_t local_168;
  uint local_154;
  long local_150;
  undefined8 local_148;
  ulong local_140;
  void *local_138;
  int64_t local_130;
  StringBuffer local_128;
  JSValueUnion local_108;
  int64_t local_100;
  JSValueUnion local_f8;
  int64_t local_f0;
  ulong local_e8;
  undefined8 local_e0;
  JSValueUnion local_d8;
  int64_t local_d0;
  JSValueUnion local_c8;
  int64_t local_c0;
  JSValueUnion local_b8;
  int64_t local_b0;
  JSValueUnion local_a8;
  ValueBuffer local_a0;
  JSValueUnion local_40;
  int64_t iStack_38;
  
  if ((int)this_val.tag != -1) {
    JVar14.float64 = 0.0;
    JS_ThrowTypeError(ctx,"not an object",this_val.tag,CONCAT44(in_register_0000000c,argc));
    local_168 = 6;
    goto LAB_0013f34a;
  }
  JVar14 = (JSValueUnion)argv[1].u.ptr;
  iVar15 = argv[1].tag;
  JVar20 = *(JSValue *)&argv[1].u;
  local_128.len = 0;
  local_128.size = 0;
  local_128.is_wide_char = 0;
  local_128.error_status = 0;
  local_128.ctx = ctx;
  local_128.str = js_alloc_string(ctx,0,0);
  if (local_128.str == (JSString *)0x0) {
    local_128._16_8_ = local_128._16_8_ & 0xffffffff;
    local_128.error_status = -1;
  }
  local_a0.arr = local_a0.def;
  local_a0.len = 0;
  local_a0.size = 4;
  local_a0.error_status = 0;
  local_a0.ctx = ctx;
  JVar19 = JS_ToStringInternal(ctx,*argv,0);
  p_18 = JVar19.u;
  uVar11 = (uint)JVar19.tag;
  if (uVar11 == 6) {
    JVar14.float64 = 0.0;
    local_1d0.float64 = 0.0;
    JVar21 = (JSValue)(ZEXT816(6) << 0x40);
    uVar7 = 0;
    _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
    JVar23 = (JSValue)(ZEXT816(3) << 0x40);
    JVar22 = (JSValue)(ZEXT816(3) << 0x40);
    local_198 = 3;
    local_190 = 3;
    JVar20 = (JSValue)(ZEXT816(3) << 0x40);
    goto LAB_0013f20e;
  }
  if ((int)iVar15 == -1) {
    uVar1 = *(ushort *)((long)JVar14.ptr + 6);
    if (uVar1 != 0xd) {
      if (uVar1 == 0x29) {
        cVar17 = *(char *)(*(long *)((long)JVar14.ptr + 0x30) + 0x20);
      }
      else {
        cVar17 = ctx->rt->class_array[uVar1].call != (JSClassCall *)0x0;
      }
      if (cVar17 == '\0') goto LAB_0013e439;
    }
    JVar20 = (JSValue)(ZEXT816(3) << 0x40);
    local_148 = 0;
LAB_0013e4b5:
    local_188 = JVar20.u;
    JVar21 = JS_GetPropertyInternal(ctx,this_val,0x6e,this_val,0);
    iVar2 = JS_ToBoolFree(ctx,JVar21);
    if (iVar2 < 0) {
      JVar21 = (JSValue)(ZEXT816(6) << 0x40);
      uVar7 = 0;
    }
    else {
      if (iVar2 == 0) {
        unicode = 0;
        local_130 = iVar15;
      }
      else {
        JVar21 = JS_GetPropertyInternal(ctx,this_val,0x6f,this_val,0);
        unicode = JS_ToBoolFree(ctx,JVar21);
        if ((unicode < 0) ||
           (local_130 = iVar15,
           iVar3 = JS_SetPropertyInternal(ctx,this_val,0x55,(JSValue)ZEXT816(0),0x4000), iVar3 < 0))
        {
          JVar14.float64 = 0.0;
          local_1d0.float64 = 0.0;
          JVar21 = (JSValue)(ZEXT816(6) << 0x40);
          uVar7 = 0;
          _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
          JVar23 = (JSValue)(ZEXT816(3) << 0x40);
          JVar22 = (JSValue)(ZEXT816(3) << 0x40);
          local_198 = 3;
          local_190 = 3;
          goto LAB_0013f20e;
        }
      }
      local_a8 = JVar14;
      if (((local_188.ptr == (void *)0x0) || (iVar2 == 0)) ||
         ((*(ulong *)((long)local_188.ptr + 4) & 0x7fffffff) != 0)) {
LAB_0013e6f3:
        v_02 = (JSValue)(ZEXT816(3) << 0x40);
        do {
          local_1d0 = v_02.u;
          JVar21 = JS_RegExpExec(ctx,this_val,JVar19);
          JVar14 = JVar21.u;
          uVar5 = (uint)JVar21.tag;
          if (uVar5 == 2) {
LAB_0013ea0c:
            if (local_a0.len < 1) {
              from = 0;
              _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
              JVar23 = (JSValue)(ZEXT816(3) << 0x40);
              JVar22 = (JSValue)(ZEXT816(3) << 0x40);
              local_198 = 3;
              goto LAB_0013f10b;
            }
            JVar14 = (JSValueUnion)(local_a0.arr)->u;
            pvVar12 = ((JSValueUnion *)((long)local_a0.arr + 8))->ptr;
            iVar2 = js_get_length32(ctx,&local_154,*local_a0.arr);
            if (iVar2 < 0) {
              _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
              JVar23 = (JSValue)(ZEXT816(3) << 0x40);
              JVar22 = (JSValue)(ZEXT816(3) << 0x40);
              local_198 = 3;
              goto LAB_0013f1ed;
            }
            from = 0;
            _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
            JVar23 = (JSValue)(ZEXT816(3) << 0x40);
            JVar22 = (JSValue)(ZEXT816(3) << 0x40);
            local_198 = 3;
            local_150 = 0;
            goto LAB_0013ea99;
          }
          if ((uVar5 == 6) || (local_a0.error_status != 0)) break;
          if (local_a0.size <= local_a0.len) {
            uVar8 = local_a0.len + (local_a0.len >> 1) + 0x1fU & 0xffffffef;
            size = (long)(int)uVar8 << 4;
            if (local_a0.arr == local_a0.def) {
              pJVar6 = (JSValueUnion *)
                       js_realloc2(local_a0.ctx,(void *)0x0,size,(size_t *)&local_108.int32);
              if (pJVar6 != (JSValueUnion *)0x0) {
                pJVar6[6] = local_a0.def[3].u;
                pJVar6[7] = (JSValueUnion)local_a0.def[3].tag;
                pJVar6[4] = local_a0.def[2].u;
                pJVar6[5] = (JSValueUnion)local_a0.def[2].tag;
                pJVar6[2] = local_a0.def[1].u;
                pJVar6[3] = (JSValueUnion)local_a0.def[1].tag;
                *pJVar6 = local_a0.def[0].u;
                pJVar6[1] = (JSValueUnion)local_a0.def[0].tag;
                goto LAB_0013e7f5;
              }
            }
            else {
              pJVar6 = (JSValueUnion *)
                       js_realloc2(local_a0.ctx,local_a0.arr,size,(size_t *)&local_108.int32);
              if (pJVar6 != (JSValueUnion *)0x0) {
LAB_0013e7f5:
                local_a0.size = uVar8 + (int)((ulong)local_108.ptr >> 4);
                local_a0.arr = (JSValue *)pJVar6;
                goto LAB_0013e819;
              }
            }
            value_buffer_free(&local_a0);
            if ((0xfffffff4 < uVar5) &&
               (iVar2 = *JVar14.ptr, *(int *)JVar14.ptr = iVar2 + -1, iVar2 < 2)) {
              __JS_FreeValueRT((local_a0.ctx)->rt,JVar21);
            }
            local_a0.error_status = -1;
            goto LAB_0013e9cd;
          }
LAB_0013e819:
          iVar3 = local_a0.len + 1;
          ((JSValueUnion *)((long)local_a0.arr + (long)local_a0.len * 2 * 8))->ptr = (void *)JVar14;
          *(int64_t *)((long)local_a0.arr + ((long)local_a0.len * 2 + 1) * 8) = JVar21.tag;
          local_a0.len = iVar3;
          if (iVar2 == 0) goto LAB_0013ea0c;
          local_190._0_4_ = (uint)v_02.tag;
          if ((0xfffffff4 < (uint)local_190) &&
             (iVar3 = *local_1d0.ptr, *(int *)local_1d0.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,v_02);
          }
          JVar21 = JS_GetPropertyValue(ctx,JVar21,(JSValue)ZEXT816(0));
          v_02 = JS_ToStringFree(ctx,JVar21);
          if ((int)v_02.tag == -7) {
            if ((*(uint *)((long)v_02.u.ptr + 4) & 0x7fffffff) != 0) goto LAB_0013e94d;
            JVar21 = JS_GetPropertyInternal(ctx,this_val,0x55,this_val,0);
            iVar3 = JS_ToLengthFree(ctx,(int64_t *)&local_108.int32,JVar21);
            if (iVar3 < 0) break;
            uVar7 = string_advance_index((JSString *)p_18.ptr,(int64_t)local_108,unicode);
            bVar18 = (long)(int)uVar7 == uVar7;
            JVar14.float64 = (double)(long)uVar7;
            if (bVar18) {
              JVar14.ptr = (void *)(uVar7 & 0xffffffff);
            }
            iVar15 = 7;
            if (bVar18) {
              iVar15 = 0;
            }
            JVar22.tag = iVar15;
            JVar22.u.float64 = JVar14.float64;
            uVar5 = JS_SetPropertyInternal(ctx,this_val,0x55,JVar22,0x4000);
            if (-1 < (int)uVar5) goto LAB_0013e94d;
            uVar5 = uVar5 >> 0x1e & 0xfffffffe;
          }
          else {
            if ((int)v_02.tag == 6) break;
LAB_0013e94d:
            uVar5 = 0;
          }
        } while (uVar5 == 0);
        local_1d0 = v_02.u;
LAB_0013e9cd:
        local_190 = v_02.tag;
        JVar14.float64 = v_02.u.float64 & 0xffffffff00000000;
        JVar21 = (JSValue)(ZEXT816(6) << 0x40);
        uVar7 = 0;
        _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
        JVar23 = (JSValue)(ZEXT816(3) << 0x40);
        JVar22 = (JSValue)(ZEXT816(3) << 0x40);
        local_198 = 3;
        goto LAB_0013f20e;
      }
      JVar21 = JS_GetPropertyInternal(ctx,this_val,0x3c,this_val,0);
      if ((uint)JVar21.tag != 6) {
        BVar4 = js_same_value(ctx,JVar21,ctx->regexp_ctor);
        if ((0xfffffff4 < (uint)JVar21.tag) &&
           (iVar3 = *JVar21.u.ptr, *(int *)JVar21.u.ptr = iVar3 + -1, iVar3 < 2)) {
          __JS_FreeValueRT(ctx->rt,JVar21);
        }
        if (BVar4 == 0) goto LAB_0013e6f3;
        JVar21 = JS_GetPropertyInternal(ctx,this_val,0x86,this_val,0);
        JVar14 = JVar21.u;
        if ((JVar21.tag & 0xffffffffU) != 6) {
          bVar18 = true;
          if ((((uint)JVar21.tag == 0xffffffff) && (*(short *)((long)JVar14.ptr + 6) == 0xc)) &&
             (*(code **)((long)JVar14.ptr + 0x38) == js_regexp_exec)) {
            bVar18 = *(short *)((long)JVar14.ptr + 0x42) != 0;
          }
          if ((0xfffffff4 < (uint)JVar21.tag) &&
             (iVar3 = *JVar14.ptr, *(int *)JVar14.ptr = iVar3 + -1, iVar3 < 2)) {
            __JS_FreeValueRT(ctx->rt,JVar21);
          }
          if (bVar18) goto LAB_0013e6f3;
        }
      }
      JVar21 = JS_RegExpDelete(ctx,this_val,JVar19);
      uVar7 = (ulong)JVar21.u.ptr & 0xffffffff00000000;
    }
  }
  else {
LAB_0013e439:
    JVar20 = JS_ToStringInternal(ctx,JVar20,0);
    if ((int)JVar20.tag != 6) {
      local_148 = CONCAT71(JVar20.u._1_7_,1);
      goto LAB_0013e4b5;
    }
    JVar21 = (JSValue)(ZEXT816(6) << 0x40);
    uVar7 = 0;
  }
  _local_1b8 = (JSValue)(ZEXT816(3) << 0x40);
  JVar23 = (JSValue)(ZEXT816(3) << 0x40);
  local_1d0.float64 = 0.0;
  JVar14.float64 = 0.0;
  JVar22 = (JSValue)(ZEXT816(3) << 0x40);
  local_198 = 3;
  local_190 = 3;
  goto LAB_0013f20e;
LAB_0013f10b:
  local_1d0 = v_02.u;
  string_buffer_concat
            (&local_128,(JSString *)p_18.ptr,from,*(uint *)((long)p_18.ptr + 4) & 0x7fffffff);
  JVar21 = string_buffer_end(&local_128);
  uVar7 = (ulong)JVar21.u.ptr & 0xffffffff00000000;
  JVar14 = local_1d0;
  goto LAB_0013f229;
  while( true ) {
    obj.tag = (int64_t)pvVar12;
    obj.u.ptr = JVar14.ptr;
    this_obj.tag = (int64_t)pvVar12;
    this_obj.u.ptr = JVar14.ptr;
    JVar21 = JS_GetPropertyInternal(ctx,obj,0x57,this_obj,0);
    iVar2 = JS_ToLengthFree(ctx,(int64_t *)&local_140,JVar21);
    if (iVar2 != 0) break;
    uVar7 = (ulong)((uint)*(undefined8 *)((long)p_18.ptr + 4) & 0x7fffffff);
    if (((long)local_140 <= (long)uVar7) && (uVar7 = local_140, (long)local_140 < 0)) {
      local_140 = 0;
      uVar7 = local_140;
    }
    local_140 = uVar7;
    uVar7 = local_140;
    if (0xfffffff4 < (uint)JVar22.tag) {
      v.u.ptr = (void *)((ulong)local_1c8.ptr & 0xffffffff | local_198 << 0x20);
      iVar2 = *v.u.ptr;
      *(int *)v.u.ptr = iVar2 + -1;
      if (iVar2 < 2) {
        v.tag = JVar22.tag;
        __JS_FreeValueRT(ctx->rt,v);
      }
    }
    sh = ctx->array_shape;
    (sh->header).ref_count = (sh->header).ref_count + 1;
    JVar22 = JS_NewObjectFromShape(ctx,sh,2);
    local_198 = (ulong)JVar22.u.ptr >> 0x20;
    if ((int)JVar22.tag == 6) break;
    if (0xfffffff4 < (uint)v_02.tag) {
      *(int *)local_1d0.ptr = *local_1d0.ptr + 1;
    }
    _local_40 = v_02;
    iVar2 = JS_DefinePropertyValueValue(ctx,JVar22,(JSValue)ZEXT816(0),v_02,0x4007);
    if (iVar2 < 0) break;
    uVar16 = (ulong)local_154;
    uVar9 = 1;
    local_138 = pvVar12;
    if (1 < uVar16) {
      idx = 1;
      do {
        obj_00.tag = (int64_t)local_138;
        obj_00.u.ptr = JVar14.ptr;
        JVar21 = JS_GetPropertyInt64(ctx,obj_00,idx);
        if ((int)JVar21.tag != 3) {
          if ((int)JVar21.tag == 6) goto LAB_0013f1fc;
          JVar21 = JS_ToStringFree(ctx,JVar21);
          if ((int)JVar21.tag == 6) goto LAB_0013f1fc;
        }
        iVar2 = JS_DefinePropertyValueInt64(ctx,JVar22,idx,JVar21,0x4007);
        if (iVar2 < 0) goto LAB_0013f1fc;
        idx = idx + 1;
        uVar9 = uVar16;
      } while (uVar16 != idx);
    }
    if (0xfffffff4 < local_1b8._8_4_) {
      iVar2 = *local_1b8.ptr;
      *(int *)local_1b8.ptr = iVar2 + -1;
      if (iVar2 < 2) {
        __JS_FreeValueRT(ctx->rt,_local_1b8);
      }
    }
    obj_01.tag = (int64_t)local_138;
    obj_01.u.ptr = JVar14.ptr;
    this_obj_00.tag = (int64_t)local_138;
    this_obj_00.u.ptr = JVar14.ptr;
    _local_1b8 = JS_GetPropertyInternal(ctx,obj_01,0x87,this_obj_00,0);
    uVar5 = local_1b8._8_4_;
    if (uVar5 == 6) break;
    local_180 = (uint)uVar7;
    if ((char)local_148 == '\0') {
      iVar2 = JS_DefinePropertyValueInt64(ctx,JVar22,uVar9,(JSValue)ZEXT416(local_180),0x4007);
      if (iVar2 < 0) break;
      if (0xfffffff4 < uVar11) {
        *(int *)p_18.ptr = *p_18.ptr + 1;
      }
      uVar8 = (int)uVar9 + 1;
      iVar2 = JS_DefinePropertyValueInt64(ctx,JVar22,(ulong)uVar8,JVar19,0x4007);
      if (iVar2 < 0) break;
      if (uVar5 != 3) {
        if (0xfffffff4 < uVar5) {
          *(int *)local_1b8.ptr = *local_1b8.ptr + 1;
        }
        uVar8 = (int)uVar9 + 2;
        iVar2 = JS_DefinePropertyValueInt64(ctx,JVar22,(ulong)uVar8,_local_1b8,0x4007);
        if (iVar2 < 0) break;
      }
      local_108.float64 = local_108.float64 & 0xffffffff00000000;
      local_100 = 3;
      _local_f8 = JVar22;
      if (0xfffffff4 < (uint)JVar23.tag) {
        uVar5 = *local_1c0.ptr;
        uVar8 = uVar5 - 1;
        *(uint *)local_1c0.ptr = uVar8;
        if ((int)uVar5 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar23);
        }
      }
      this_val_00.tag = local_130;
      this_val_00.u.float64 = local_a8.float64;
      JVar21 = js_function_apply(ctx,this_val_00,uVar8,(JSValue *)&local_108,0);
      JVar23 = JS_ToStringFree(ctx,JVar21);
    }
    else {
      if (uVar5 == 3) {
        uVar9 = 0;
        JVar21 = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        JVar21 = JS_ToObject(ctx,_local_1b8);
        if ((int)JVar21.tag == 6) break;
        uVar9 = (ulong)JVar21.u.ptr & 0xffffffff00000000;
      }
      iVar15 = JVar21.tag;
      local_e8 = uVar7 & 0xffffffff;
      local_e0 = 0;
      JVar13.ptr = (void *)((ulong)JVar21.u.ptr & 0xffffffff | uVar9);
      JVar14 = JVar22.u;
      local_c8.ptr = JVar13.ptr;
      local_c0 = iVar15;
      _local_b8 = JVar20;
      _local_f8 = JVar19;
      _local_108 = v_02;
      _local_d8 = JVar22;
      if (0xfffffff4 < (uint)JVar23.tag) {
        uVar8 = *local_1c0.ptr;
        uVar5 = uVar8 - 1;
        uVar9 = (ulong)uVar5;
        *(uint *)local_1c0.ptr = uVar5;
        JVar14 = local_1c0;
        if ((int)uVar8 < 2) {
          __JS_FreeValueRT(ctx->rt,JVar23);
          JVar14 = extraout_RDX;
        }
      }
      JVar23.tag = (int64_t)JVar14.ptr;
      JVar23.u.ptr = &local_108;
      JVar23 = js_string___GetSubstitution(ctx,JVar23,(int)uVar9,local_1a8);
      if ((0xfffffff4 < (uint)JVar21.tag) &&
         (iVar2 = *JVar13.ptr, *(int *)JVar13.ptr = iVar2 + -1, iVar2 < 2)) {
        v_00.tag = iVar15;
        v_00.u.ptr = JVar13.ptr;
        __JS_FreeValueRT(ctx->rt,v_00);
      }
    }
    if ((int)JVar23.tag == 6) break;
    if ((long)(int)from <= (long)uVar7) {
      string_buffer_concat(&local_128,(JSString *)p_18.ptr,from,local_180);
      string_buffer_concat_value(&local_128,JVar23);
      from = (*(uint *)((long)local_1d0.ptr + 4) & 0x7fffffff) + local_180;
    }
    lVar10 = local_150 + 1;
    if (local_a0.len <= lVar10) goto LAB_0013f10b;
    JVar14 = (JSValueUnion)((JSValueUnion *)((long)local_a0.arr + lVar10 * 2 * 8))->ptr;
    pvVar12 = ((JSValueUnion *)((long)local_a0.arr + (lVar10 * 2 + 1) * 8))->ptr;
    obj_02.tag = (int64_t)pvVar12;
    obj_02.u.ptr = JVar14.ptr;
    local_150 = lVar10;
    iVar2 = js_get_length32(ctx,&local_154,obj_02);
    if (iVar2 < 0) break;
LAB_0013ea99:
    local_1a8 = (JSValue *)JVar23.tag;
    local_1c0 = JVar23.u;
    local_1c8 = JVar22.u;
    if ((0xfffffff4 < (uint)v_02.tag) &&
       (iVar2 = *v_02.u.ptr, *(int *)v_02.u.ptr = iVar2 + -1, iVar2 < 2)) {
      __JS_FreeValueRT(ctx->rt,v_02);
    }
    JVar21.tag = (int64_t)pvVar12;
    JVar21.u.ptr = JVar14.ptr;
    JVar21 = JS_GetPropertyValue(ctx,JVar21,(JSValue)ZEXT816(0));
    v_02 = JS_ToStringFree(ctx,JVar21);
    local_1d0 = v_02.u;
    if ((uint)v_02.tag == 6) break;
  }
LAB_0013f1ed:
  local_1d0 = v_02.u;
LAB_0013f1fc:
  local_190 = v_02.tag;
  JVar14.float64 = v_02.u.float64 & 0xffffffff00000000;
  JVar21 = (JSValue)(ZEXT816(6) << 0x40);
  uVar7 = 0;
LAB_0013f20e:
  v_02.tag = local_190;
  v_02.u.float64 = local_1d0.float64;
  (*((local_128.ctx)->rt->mf).js_free)(&(local_128.ctx)->rt->malloc_state,local_128.str);
LAB_0013f229:
  local_190 = v_02.tag;
  local_1d0 = v_02.u;
  local_188 = JVar20.u;
  local_1c8 = JVar22.u;
  local_168 = JVar21.tag;
  local_1c0 = JVar23.u;
  value_buffer_free(&local_a0);
  if ((0xfffffff4 < (uint)JVar20.tag) &&
     (iVar2 = *local_188.ptr, *(int *)local_188.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar20);
  }
  if (0xfffffff4 < (uint)v_02.tag) {
    JVar20.u.ptr = (void *)((ulong)local_1d0.ptr & 0xffffffff |
                           (ulong)JVar14.ptr & 0xffffffff00000000);
    iVar2 = *JVar20.u.ptr;
    *(int *)JVar20.u.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      JVar20.tag = local_190;
      __JS_FreeValueRT(ctx->rt,JVar20);
    }
  }
  if (0xfffffff4 < (uint)JVar22.tag) {
    v_01.u.ptr = (void *)((ulong)local_1c8.ptr & 0xffffffff | local_198 << 0x20);
    iVar2 = *v_01.u.ptr;
    *(int *)v_01.u.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      v_01.tag = JVar22.tag;
      __JS_FreeValueRT(ctx->rt,v_01);
    }
  }
  if ((0xfffffff4 < (uint)JVar23.tag) &&
     (iVar2 = *local_1c0.ptr, *(int *)local_1c0.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar23);
  }
  if (0xfffffff4 < local_1b8._8_4_) {
    iVar2 = *local_1b8.ptr;
    *(int *)local_1b8.ptr = iVar2 + -1;
    if (iVar2 < 2) {
      __JS_FreeValueRT(ctx->rt,_local_1b8);
    }
  }
  if ((0xfffffff4 < uVar11) && (iVar2 = *p_18.ptr, *(int *)p_18.ptr = iVar2 + -1, iVar2 < 2)) {
    __JS_FreeValueRT(ctx->rt,JVar19);
  }
  JVar14.ptr = (void *)(uVar7 | (ulong)JVar21.u.ptr & 0xffffffff);
LAB_0013f34a:
  JVar19.tag = local_168;
  JVar19.u.ptr = JVar14.ptr;
  return JVar19;
}

Assistant:

static JSValue js_regexp_Symbol_replace(JSContext *ctx, JSValueConst this_val,
                                        int argc, JSValueConst *argv)
{
    // [Symbol.replace](str, rep)
    JSValueConst rx = this_val, rep = argv[1];
    JSValueConst args[6];
    JSValue str, rep_val, matched, tab, rep_str, namedCaptures, res;
    JSString *sp, *rp;
    StringBuffer b_s, *b = &b_s;
    ValueBuffer v_b, *results = &v_b;
    int nextSourcePosition, n, j, functionalReplace, is_global, fullUnicode;
    uint32_t nCaptures;
    int64_t position;

    if (!JS_IsObject(rx))
        return JS_ThrowTypeErrorNotAnObject(ctx);

    string_buffer_init(ctx, b, 0);
    value_buffer_init(ctx, results);

    rep_val = JS_UNDEFINED;
    matched = JS_UNDEFINED;
    tab = JS_UNDEFINED;
    rep_str = JS_UNDEFINED;
    namedCaptures = JS_UNDEFINED;

    str = JS_ToString(ctx, argv[0]);
    if (JS_IsException(str))
        goto exception;
        
    sp = JS_VALUE_GET_STRING(str);
    rp = NULL;
    functionalReplace = JS_IsFunction(ctx, rep);
    if (!functionalReplace) {
        rep_val = JS_ToString(ctx, rep);
        if (JS_IsException(rep_val))
            goto exception;
        rp = JS_VALUE_GET_STRING(rep_val);
    }
    fullUnicode = 0;
    is_global = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_global));
    if (is_global < 0)
        goto exception;
    if (is_global) {
        fullUnicode = JS_ToBoolFree(ctx, JS_GetProperty(ctx, rx, JS_ATOM_unicode));
        if (fullUnicode < 0)
            goto exception;
        if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt32(ctx, 0)) < 0)
            goto exception;
    }

    if (rp && rp->len == 0 && is_global && js_is_standard_regexp(ctx, rx)) {
        /* use faster version for simple cases */
        res = JS_RegExpDelete(ctx, rx, str);
        goto done;
    }
    for(;;) {
        JSValue result;
        result = JS_RegExpExec(ctx, rx, str);
        if (JS_IsException(result))
            goto exception;
        if (JS_IsNull(result))
            break;
        if (value_buffer_append(results, result) < 0)
            goto exception;
        if (!is_global)
            break;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_IsEmptyString(matched)) {
            /* always advance of at least one char */
            int64_t thisIndex, nextIndex;
            if (JS_ToLengthFree(ctx, &thisIndex, JS_GetProperty(ctx, rx, JS_ATOM_lastIndex)) < 0)
                goto exception;
            nextIndex = string_advance_index(sp, thisIndex, fullUnicode);
            if (JS_SetProperty(ctx, rx, JS_ATOM_lastIndex, JS_NewInt64(ctx, nextIndex)) < 0)
                goto exception;
        }
    }
    nextSourcePosition = 0;
    for(j = 0; j < results->len; j++) {
        JSValueConst result;
        result = results->arr[j];
        if (js_get_length32(ctx, &nCaptures, result) < 0)
            goto exception;
        JS_FreeValue(ctx, matched);
        matched = JS_ToStringFree(ctx, JS_GetPropertyInt64(ctx, result, 0));
        if (JS_IsException(matched))
            goto exception;
        if (JS_ToLengthFree(ctx, &position, JS_GetProperty(ctx, result, JS_ATOM_index)))
            goto exception;
        if (position > sp->len)
            position = sp->len;
        else if (position < 0)
            position = 0;
        /* ignore substition if going backward (can happen
           with custom regexp object) */
        JS_FreeValue(ctx, tab);
        tab = JS_NewArray(ctx);
        if (JS_IsException(tab))
            goto exception;
        if (JS_DefinePropertyValueInt64(ctx, tab, 0, JS_DupValue(ctx, matched),
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            goto exception;
        for(n = 1; n < nCaptures; n++) {
            JSValue capN;
            capN = JS_GetPropertyInt64(ctx, result, n);
            if (JS_IsException(capN))
                goto exception;
            if (!JS_IsUndefined(capN)) {
                capN = JS_ToStringFree(ctx, capN);
                if (JS_IsException(capN))
                    goto exception;
            }
            if (JS_DefinePropertyValueInt64(ctx, tab, n, capN,
                                            JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
        }
        JS_FreeValue(ctx, namedCaptures);
        namedCaptures = JS_GetProperty(ctx, result, JS_ATOM_groups);
        if (JS_IsException(namedCaptures))
            goto exception;
        if (functionalReplace) {
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_NewInt32(ctx, position), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, str), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                goto exception;
            if (!JS_IsUndefined(namedCaptures)) {
                if (JS_DefinePropertyValueInt64(ctx, tab, n++, JS_DupValue(ctx, namedCaptures), JS_PROP_C_W_E | JS_PROP_THROW) < 0)
                    goto exception;
            }
            args[0] = JS_UNDEFINED;
            args[1] = tab;
            JS_FreeValue(ctx, rep_str);
            rep_str = JS_ToStringFree(ctx, js_function_apply(ctx, rep, 2, args, 0));
        } else {
            JSValue namedCaptures1;
            if (!JS_IsUndefined(namedCaptures)) {
                namedCaptures1 = JS_ToObject(ctx, namedCaptures);
                if (JS_IsException(namedCaptures1))
                    goto exception;
            } else {
                namedCaptures1 = JS_UNDEFINED;
            }
            args[0] = matched;
            args[1] = str;
            args[2] = JS_NewInt32(ctx, position);
            args[3] = tab;
            args[4] = namedCaptures1;
            args[5] = rep_val;
            JS_FreeValue(ctx, rep_str);
            rep_str = js_string___GetSubstitution(ctx, JS_UNDEFINED, 6, args);
            JS_FreeValue(ctx, namedCaptures1);
        }
        if (JS_IsException(rep_str))
            goto exception;
        if (position >= nextSourcePosition) {
            string_buffer_concat(b, sp, nextSourcePosition, position);
            string_buffer_concat_value(b, rep_str);
            nextSourcePosition = position + JS_VALUE_GET_STRING(matched)->len;
        }
    }
    string_buffer_concat(b, sp, nextSourcePosition, sp->len);
    res = string_buffer_end(b);
    goto done1;

exception:
    res = JS_EXCEPTION;
done:
    string_buffer_free(b);
done1:
    value_buffer_free(results);
    JS_FreeValue(ctx, rep_val);
    JS_FreeValue(ctx, matched);
    JS_FreeValue(ctx, tab);
    JS_FreeValue(ctx, rep_str);
    JS_FreeValue(ctx, namedCaptures);
    JS_FreeValue(ctx, str);
    return res;
}